

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O2

Abc_Cex_t * Cex_ManGenCex(Cec_ManSat_t *p,int iOut)

{
  Gia_Man_t *p_00;
  Vec_Int_t *p_01;
  int iVar1;
  Abc_Cex_t *pAVar2;
  Gia_Obj_t *pObj;
  uint i;
  
  i = 0;
  pAVar2 = Abc_CexAlloc(0,p->pAig->vCis->nSize,1);
  pAVar2->iPo = iOut;
  pAVar2->iFrame = 0;
  while( true ) {
    p_00 = p->pAig;
    p_01 = p_00->vCis;
    if (p_01->nSize <= (int)i) break;
    iVar1 = Vec_IntEntry(p_01,i);
    pObj = Gia_ManObj(p_00,iVar1);
    iVar1 = Cec_ObjSatNum(p,pObj);
    if (0 < iVar1) {
      iVar1 = sat_solver_var_value(p->pSat,iVar1);
      if (iVar1 != 0) {
        (&pAVar2[1].iPo)[i >> 5] = (&pAVar2[1].iPo)[i >> 5] | 1 << ((byte)i & 0x1f);
      }
    }
    i = i + 1;
  }
  return pAVar2;
}

Assistant:

Abc_Cex_t * Cex_ManGenCex( Cec_ManSat_t * p, int iOut )
{
    Abc_Cex_t * pCex;
    int i;
    pCex = Abc_CexAlloc( 0, Gia_ManCiNum(p->pAig), 1 );
    pCex->iPo = iOut;
    pCex->iFrame = 0;
    for ( i = 0; i < Gia_ManCiNum(p->pAig); i++ )
    {
        int iVar = Cec_ObjSatNum(p, Gia_ManCi(p->pAig, i));
        if ( iVar > 0 && sat_solver_var_value(p->pSat, iVar) )
            pCex->pData[i>>5] |= (1<<(i & 31));     
    }
    return pCex;
}